

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseNumberExpression(Parser *this)

{
  NumericConstant *__x;
  CalculationEngine *this_00;
  pointer __dest;
  Parser *in_RSI;
  ulong uVar1;
  size_t __n;
  NumericConstant value;
  NumericConstant local_68;
  vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> local_40;
  uchar local_28;
  
  __x = Token::numericValue(&in_RSI->mCurrentToken);
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
            (&local_40,&__x->mChars);
  local_28 = __x->mBase;
  nextToken(in_RSI);
  this_00 = (CalculationEngine *)operator_new(0x28);
  local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (long)local_40.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_40.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar1 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar1 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar1);
  }
  local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar1;
  __n = (long)local_40.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_40.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_start = __dest;
  if (__n != 0) {
    local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
    _M_impl.super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,local_40.
                   super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
  }
  local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
  _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
  local_68.mBase = local_28;
  NumberExpression::NumberExpression((NumberExpression *)this_00,&local_68);
  this->mCalcEngine = this_00;
  if (local_68.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.mChars.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseNumberExpression() {
	auto value = mCurrentToken.numericValue();
	nextToken(); //Consume the number
	return std::unique_ptr<NumberExpression>(new NumberExpression(value));
}